

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O1

_Bool ethash_quick_check_difficulty
                (ethash_h256_t *header_hash,uint64_t nonce,ethash_h256_t *mix_hash,
                ethash_h256_t *boundary)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  bool bVar4;
  ethash_h256_t return_hash;
  byte local_98;
  byte local_97 [31];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  uint64_t local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_78 = *(undefined8 *)header_hash->b;
  uStack_70 = *(undefined8 *)(header_hash->b + 8);
  local_68 = *(undefined8 *)(header_hash->b + 0x10);
  uStack_60 = *(undefined8 *)(header_hash->b + 0x18);
  local_58 = nonce;
  sha3_512((uint8_t *)&local_78,0x40,(uint8_t *)&local_78,0x28);
  local_38 = *(undefined8 *)mix_hash->b;
  uStack_30 = *(undefined8 *)(mix_hash->b + 8);
  local_28 = *(undefined8 *)(mix_hash->b + 0x10);
  uStack_20 = *(undefined8 *)(mix_hash->b + 0x18);
  sha3_256(&local_98,0x20,(uint8_t *)&local_78,0x60);
  bVar3 = boundary->b[0];
  if (local_98 == bVar3) {
    uVar1 = 0;
    do {
      uVar2 = uVar1;
      bVar4 = 0x1e < uVar2;
      if (uVar2 == 0x1f) goto LAB_0012b3b2;
      local_98 = local_97[uVar2];
      bVar3 = boundary->b[uVar2 + 1];
      uVar1 = uVar2 + 1;
    } while (local_98 == bVar3);
    bVar4 = 0x1e < uVar2;
  }
  else {
    bVar4 = false;
  }
  local_98 = local_98 < bVar3;
LAB_0012b3b2:
  return (_Bool)(bVar4 | local_98 & 1);
}

Assistant:

bool ethash_quick_check_difficulty(
	ethash_h256_t const* header_hash,
	uint64_t const nonce,
	ethash_h256_t const* mix_hash,
	ethash_h256_t const* boundary
)
{

	ethash_h256_t return_hash;
	ethash_quick_hash(&return_hash, header_hash, nonce, mix_hash);
	return ethash_check_difficulty(&return_hash, boundary);
}